

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

PIPELINE_RESOURCE_FLAGS
Diligent::SPIRVShaderResourceAttribs::GetPipelineResourceFlags(ResourceType Type)

{
  undefined1 local_9;
  ResourceType Type_local;
  
  if (Type - 3 < 2) {
    local_9 = PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER;
  }
  else if (Type == 6) {
    local_9 = PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;
  }
  else {
    local_9 = PIPELINE_RESOURCE_FLAG_NONE;
  }
  return local_9;
}

Assistant:

PIPELINE_RESOURCE_FLAGS SPIRVShaderResourceAttribs::GetPipelineResourceFlags(ResourceType Type)
{
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please handle the new resource type below");
    switch (Type)
    {
        case SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer:
        case SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer:
            return PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER;

        case SPIRVShaderResourceAttribs::ResourceType::SampledImage:
            return PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;

        default:
            return PIPELINE_RESOURCE_FLAG_NONE;
    }
}